

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void runtime::printConstantArray<std::__cxx11::string>
               (ostream *out,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *vec)

{
  pointer pbVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val;
  pointer pbVar3;
  
  pbVar1 = (vec->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar3 = (vec->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1) {
    poVar2 = std::operator<<(out,"| |");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,"| ");
    poVar2 = std::operator<<(poVar2,(string *)pbVar3);
    std::operator<<(poVar2,'\n');
  }
  return;
}

Assistant:

void printConstantArray(std::ostream & out, const std::vector<T> & vec) {
  std::size_t i = 0;
  for (const auto& val : vec) {
    out << "| |" << i << "| " << val << '\n';
    i++;
  }
}